

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

bool __thiscall QProgressBarPrivate::repaintRequired(QProgressBarPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QWidget *this_00;
  ulong uVar5;
  bool bVar6;
  QStyle *pQVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  QLatin1StringView s;
  QLatin1StringView s_00;
  QStyleOptionProgressBar opt;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->value;
  iVar2 = this->lastPaintedValue;
  if (iVar1 == iVar2) {
    bVar12 = false;
  }
  else {
    lVar8 = (long)iVar1 - (long)iVar2;
    lVar10 = -lVar8;
    if (0 < lVar8) {
      lVar10 = lVar8;
    }
    iVar3 = *(int *)&(this->super_QWidgetPrivate).field_0x254;
    bVar12 = true;
    if ((iVar1 != iVar3) && (iVar1 != this->maximum)) {
      this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      bVar11 = true;
      iVar9 = this->maximum - iVar3;
      if (iVar9 != 0) {
        bVar11 = ((iVar1 - iVar3) * 100) / iVar9 == ((iVar2 - iVar3) * 100) / iVar9;
      }
      if ((this->field_0x264 & 1) != 0) {
        s.m_data = "%v";
        s.m_size = 2;
        bVar6 = QString::contains(&this->format,s,CaseSensitive);
        bVar12 = true;
        if (bVar6) goto LAB_0042ff0e;
        s_00.m_data = "%p";
        s_00.m_size = 2;
        bVar6 = QString::contains(&this->format,s_00,CaseSensitive);
        if (!(bool)(bVar11 | !bVar6)) goto LAB_0042ff0e;
      }
      opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      opt._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionProgressBar::QStyleOptionProgressBar(&opt);
      (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&opt);
      pQVar7 = QWidget::style(this_00);
      auVar13 = (**(code **)(*(long *)pQVar7 + 0xc0))(pQVar7,0xc,&opt,this_00);
      bVar12 = *(int *)(*(long *)&this_00->field_0x8 + 0x26c) == 1;
      uVar5 = auVar13._8_8_ >> 0x20;
      if (bVar12) {
        uVar5 = auVar13._8_8_;
      }
      iVar1 = auVar13._4_4_;
      if (bVar12) {
        iVar1 = auVar13._0_4_;
      }
      bVar12 = (double)iVar9 / (double)(((int)uVar5 - iVar1) + 1) < (double)lVar10;
      QStyleOptionProgressBar::~QStyleOptionProgressBar(&opt);
    }
  }
LAB_0042ff0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return bVar12;
  }
  __stack_chk_fail();
}

Assistant:

bool QProgressBarPrivate::repaintRequired() const
{
    Q_Q(const QProgressBar);
    if (value == lastPaintedValue)
        return false;

    const qint64 valueDifference = qAbs(qint64(value) - qint64(lastPaintedValue));

    if (value == minimum || value == maximum)
        return true;

    const int totalSteps = maximum - minimum;

    const int currentPercentage = totalSteps ? (value - minimum) * 100 / totalSteps : 0;
    const int lastPaintedPercentage = totalSteps ? (lastPaintedValue - minimum) * 100 / totalSteps
                                                 : 0;

    const int percentageChangeConstant = 1;
    const bool percentageChanged = (qAbs(currentPercentage - lastPaintedPercentage) >= percentageChangeConstant);

    if (textVisible) {
        if (format.contains("%v"_L1))
            return true;
        if (format.contains("%p"_L1) && percentageChanged)
            return true;
    }

    // Check if the bar needs to be repainted based on pixel-level differences
    QStyleOptionProgressBar opt;
    q->initStyleOption(&opt);
    QRect groove = q->style()->subElementRect(QStyle::SE_ProgressBarGroove, &opt, q);
    int grooveBlock = (q->orientation() == Qt::Horizontal) ? groove.width() : groove.height();
    const double pixelSize = static_cast<double>(totalSteps) / grooveBlock;
    return valueDifference > pixelSize;
}